

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double incircle(double *pa,double *pb,double *pc,double *pd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar5 = *pd;
  dVar7 = pd[1];
  dVar2 = *pa - dVar5;
  dVar4 = pa[1] - dVar7;
  dVar8 = *pb - dVar5;
  dVar10 = pb[1] - dVar7;
  dVar5 = *pc - dVar5;
  dVar7 = pc[1] - dVar7;
  dVar3 = dVar2 * dVar2 + dVar4 * dVar4;
  dVar9 = dVar8 * dVar8 + dVar10 * dVar10;
  dVar6 = dVar5 * dVar5 + dVar7 * dVar7;
  dVar1 = (dVar10 * dVar2 - dVar8 * dVar4) * dVar6 +
          (dVar8 * dVar7 - dVar10 * dVar5) * dVar3 + (dVar4 * dVar5 - dVar2 * dVar7) * dVar9;
  dVar5 = (ABS(dVar8 * dVar4) + ABS(dVar10 * dVar2)) * dVar6 +
          (ABS(dVar8 * dVar7) + ABS(dVar10 * dVar5)) * dVar3 +
          (ABS(dVar2 * dVar7) + ABS(dVar4 * dVar5)) * dVar9;
  dVar7 = iccerrboundA * dVar5;
  if ((dVar1 <= dVar7) && (-dVar1 <= dVar7)) {
    dVar5 = incircleadapt(pa,pb,pc,pd,dVar5);
    return dVar5;
  }
  return dVar1;
}

Assistant:

REAL incircle(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  REAL adx, bdx, cdx, ady, bdy, cdy;
  REAL bdxcdy, cdxbdy, cdxady, adxcdy, adxbdy, bdxady;
  REAL alift, blift, clift;
  REAL det;
  REAL permanent, errbound;

  adx = pa[0] - pd[0];
  bdx = pb[0] - pd[0];
  cdx = pc[0] - pd[0];
  ady = pa[1] - pd[1];
  bdy = pb[1] - pd[1];
  cdy = pc[1] - pd[1];

  bdxcdy = bdx * cdy;
  cdxbdy = cdx * bdy;
  alift = adx * adx + ady * ady;

  cdxady = cdx * ady;
  adxcdy = adx * cdy;
  blift = bdx * bdx + bdy * bdy;

  adxbdy = adx * bdy;
  bdxady = bdx * ady;
  clift = cdx * cdx + cdy * cdy;

  det = alift * (bdxcdy - cdxbdy)
      + blift * (cdxady - adxcdy)
      + clift * (adxbdy - bdxady);

  permanent = (Absolute(bdxcdy) + Absolute(cdxbdy)) * alift
            + (Absolute(cdxady) + Absolute(adxcdy)) * blift
            + (Absolute(adxbdy) + Absolute(bdxady)) * clift;
  errbound = iccerrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return incircleadapt(pa, pb, pc, pd, permanent);
}